

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util.cc
# Opt level: O2

void google::protobuf::util::anon_unknown_0::ConvertEnumDescriptor
               (EnumDescriptor *descriptor,Enum *enum_type)

{
  Edition EVar1;
  SourceContext *pSVar2;
  EnumValueDescriptor *pEVar3;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValue>_> *pVVar4;
  Arena *pAVar5;
  int i;
  int iVar6;
  
  Enum::Clear(enum_type);
  EVar1 = FileDescriptor::edition(descriptor->file_);
  iVar6 = 0;
  if (EVar1 != EDITION_PROTO2) {
    iVar6 = (EVar1 != EDITION_PROTO3) + 1;
  }
  (enum_type->field_0)._impl_.syntax_ = iVar6;
  pAVar5 = (Arena *)(enum_type->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar5 & 1) != 0) {
    pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set<>
            (&(enum_type->field_0)._impl_.name_,descriptor->all_names_ + 1,pAVar5);
  pSVar2 = Enum::mutable_source_context(enum_type);
  pAVar5 = (Arena *)(pSVar2->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar5 & 1) != 0) {
    pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set<>
            (&(pSVar2->field_0)._impl_.file_name_,descriptor->file_->name_,pAVar5);
  for (iVar6 = 0; iVar6 < descriptor->value_count_; iVar6 = iVar6 + 1) {
    pEVar3 = EnumDescriptor::value(descriptor,iVar6);
    pVVar4 = internal::RepeatedPtrFieldBase::
             Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValue>>
                       (&(enum_type->field_0)._impl_.enumvalue_.super_RepeatedPtrFieldBase);
    pAVar5 = (Arena *)(pVVar4->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar5 & 1) != 0) {
      pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::Set<>(&(pVVar4->field_0)._impl_.name_,pEVar3->all_names_,pAVar5);
    (pVVar4->field_0)._impl_.number_ = pEVar3->number_;
    ConvertOptionsInternal(&pEVar3->options_->super_Message,&(pVVar4->field_0)._impl_.options_);
  }
  ConvertOptionsInternal(&descriptor->options_->super_Message,&(enum_type->field_0)._impl_.options_)
  ;
  return;
}

Assistant:

void ConvertEnumDescriptor(const EnumDescriptor& descriptor, Enum* enum_type) {
  enum_type->Clear();
  enum_type->set_syntax(
      ConvertSyntax(FileDescriptorLegacy(descriptor.file()).edition()));

  enum_type->set_name(descriptor.full_name());
  enum_type->mutable_source_context()->set_file_name(descriptor.file()->name());
  for (int i = 0; i < descriptor.value_count(); ++i) {
    const EnumValueDescriptor& value_descriptor = *descriptor.value(i);
    EnumValue* value = enum_type->mutable_enumvalue()->Add();
    value->set_name(value_descriptor.name());
    value->set_number(value_descriptor.number());

    ConvertEnumValueOptions(value_descriptor.options(),
                            *value->mutable_options());
  }

  ConvertEnumOptions(descriptor.options(), *enum_type->mutable_options());
}